

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

int Path::rmdir(char *__path)

{
  long lVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  size_t len;
  stat statbuf;
  StackBuffer<4096UL,_char> buffer;
  string local_10f0 [32];
  stat local_10d0;
  StackBuffer<4096UL,_char> local_1040;
  
  __dirp = opendir(*(char **)__path);
  if (__dirp != (DIR *)0x0) {
    lVar1 = *(long *)(__path + 8);
    while( true ) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      if ((pdVar3->d_name[0] != '.') ||
         ((pdVar3->d_name[1] != '\0' && ((pdVar3->d_name[1] != '.' || (pdVar3->d_name[2] != '\0'))))
         )) {
        sVar4 = strlen(pdVar3->d_name);
        len = sVar4 + lVar1 + 2;
        StackBuffer<4096UL,_char>::StackBuffer(&local_1040,len);
        if (local_1040.mBuffer != (char *)0x0) {
          snprintf(local_1040.mBuffer,len,"%s/%s",*(undefined8 *)__path,pdVar3->d_name);
          iVar2 = ::stat(local_1040.mBuffer,&local_10d0);
          if (iVar2 == 0) {
            if ((local_10d0.st_mode & 0xf000) == 0x4000) {
              Path((Path *)local_10f0,local_1040.mBuffer);
              rmdir((char *)local_10f0);
              std::__cxx11::string::~string(local_10f0);
            }
            else {
              unlink(local_1040.mBuffer);
            }
          }
        }
        StackBuffer<4096UL,_char>::~StackBuffer(&local_1040);
      }
    }
    closedir(__dirp);
  }
  iVar2 = ::rmdir(*(char **)__path);
  return CONCAT31((int3)((uint)iVar2 >> 8),iVar2 == 0);
}

Assistant:

bool Path::rmdir(const Path &dir)
{
#ifdef _WIN32
    // SHFileOperation needs an absolute path.
    Path absDir = Path::resolved(dir, MakeAbsolute);
    std::wstring pathU16 = Utf8To16(dir.c_str());

    // double zero terminate the string. There *should* already be one zero
    // in c_str(), but better to be safe.
    pathU16.append(2, 0);

    // Deletion through SHFileOperation is recursive.
    SHFILEOPSTRUCTW op;
    memset(&op, 0, sizeof(SHFILEOPSTRUCTW));
    op.wFunc = FO_DELETE;
    op.pFrom = pathU16.c_str();
    op.fFlags = FOF_NO_UI;
    bool ret = (SHFileOperationW(&op) == 0);
    return ret;

#else
    DIR *d = opendir(dir.constData());
    size_t path_len = dir.size();
    union {
        char buf[PATH_MAX];
        dirent dbuf;
    };

    if (d) {
        while (dirent *p = readdir(d)) {
            /* Skip the names "." and ".." as we don't want to recurse on them. */
            if (!strcmp(p->d_name, ".") || !strcmp(p->d_name, "..")) {
                continue;
            }

            const size_t len = path_len + strlen(p->d_name) + 2;
            StackBuffer<PATH_MAX> buffer(len);

            if (buffer) {
                struct stat statbuf;
                snprintf(buffer, len, "%s/%s", dir.constData(), p->d_name);
                if (!::stat(buffer, &statbuf)) {
                    if (S_ISDIR(statbuf.st_mode)) {
                        Path::rmdir(Path(buffer));
                    } else {
                        unlink(buffer);
                    }
                }
            }
        }
        closedir(d);
    }
    return ::rmdir(dir.constData()) == 0;
#endif
}